

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

OBJ_DATA * get_obj_keeper(CHAR_DATA *ch,CHAR_DATA *keeper,char *argument)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  int count;
  int number;
  OBJ_DATA *obj;
  char arg [4608];
  undefined7 in_stack_ffffffffffffedc0;
  undefined1 in_stack_ffffffffffffedc7;
  byte bVar3;
  undefined4 in_stack_ffffffffffffedc8;
  int iVar4;
  undefined4 in_stack_ffffffffffffedcc;
  OBJ_DATA *local_1230;
  OBJ_DATA *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  
  iVar2 = number_argument((char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                          (char *)CONCAT17(in_stack_ffffffffffffedc7,in_stack_ffffffffffffedc0));
  iVar4 = 0;
  local_1230 = *(OBJ_DATA **)(in_RSI + 0x98);
  do {
    if (local_1230 == (OBJ_DATA *)0x0) {
      return (OBJ_DATA *)0x0;
    }
    if ((((local_1230->wear_loc == -1) &&
         (bVar1 = can_see_obj(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0), bVar1)) &&
        (bVar1 = can_see_obj(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0), bVar1)) &&
       (bVar1 = is_name((char *)arg._4520_8_,(char *)arg._4512_8_), bVar1)) {
      iVar4 = iVar4 + 1;
      if (iVar4 == iVar2) {
        return local_1230;
      }
      while( true ) {
        bVar3 = 0;
        if ((local_1230->next_content != (OBJ_DATA *)0x0) &&
           (bVar3 = 0, local_1230->pIndexData == local_1230->next_content->pIndexData)) {
          bVar1 = str_cmp(local_1230->short_descr,local_1230->next_content->short_descr);
          bVar3 = bVar1 ^ 0xff;
        }
        if ((bVar3 & 1) == 0) break;
        local_1230 = local_1230->next_content;
      }
    }
    local_1230 = local_1230->next_content;
  } while( true );
}

Assistant:

OBJ_DATA *get_obj_keeper(CHAR_DATA *ch, CHAR_DATA *keeper, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;

	int number = number_argument(argument, arg);
	int count = 0;

	for (obj = keeper->carrying; obj != nullptr; obj = obj->next_content)
	{
		if (obj->wear_loc == WEAR_NONE
			&& can_see_obj(keeper, obj)
			&& can_see_obj(ch, obj)
			&& is_name(arg, obj->name))
		{
			if (++count == number)
				return obj;

			/* skip other objects of the same name */
			while (obj->next_content != nullptr
				&& obj->pIndexData == obj->next_content->pIndexData
				&& !str_cmp(obj->short_descr, obj->next_content->short_descr))
			{
				obj = obj->next_content;
			}
		}
	}

	return nullptr;
}